

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c219.c
# Opt level: O3

void device_reset_c219(void *chip)

{
  long lVar1;
  
  lVar1 = 0;
  memset((void *)((long)chip + 0x20),0,0x200);
  do {
    *(undefined2 *)((long)chip + lVar1 + 0x428) = 0;
    *(undefined4 *)((long)chip + lVar1 + 0x424) = 0;
    lVar1 = lVar1 + 0x1c;
  } while (lVar1 != 0x1c0);
  *(undefined2 *)((long)chip + 0x220) = 0x1234;
  return;
}

Assistant:

static void device_reset_c219(void *chip)
{
	c219_state *info = (c219_state *)chip;
	int i;
	
	memset(info->REG, 0, sizeof(info->REG));
	
	for(i = 0; i < MAX_VOICE; i ++)
	{
		C219_VOICE *v = &info->voi[i];
		
		v->pofs = 0;
		v->pos = 0;
	}
	
	// init noise generator
	info->random = 0x1234;
	
	return;
}